

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcdr(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint i;
  long in_RDI;
  runsdef stkval;
  runsdef val;
  uint lstsiz;
  uint siz;
  uchar *lstp;
  undefined8 in_stack_ffffffffffffffb8;
  void *p;
  undefined4 in_stack_ffffffffffffffc0;
  dattyp typ;
  undefined4 in_stack_ffffffffffffffc4;
  void *pvVar5;
  uchar in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\a') {
    p = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    typ = CONCAT31((int3)((uint)in_stack_ffffffffffffffc0 >> 8),7);
    pvVar5 = p;
    iVar2 = osrp2(p);
    if (iVar2 + -2 == 0) {
      runpush((runcxdef *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
              (dattyp)((ulong)pvVar5 >> 0x20),(runsdef *)CONCAT44(in_stack_ffffffffffffffc4,typ));
    }
    else {
      uVar3 = datsiz(typ,p);
      uVar4 = (iVar2 + -2) - (uVar3 + 1);
      i = uVar4 + 2;
      if ((uint)((int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) -
                (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x38)) <= i) {
        runhcmp((runcxdef *)lstp,siz,lstsiz,(runsdef *)val.runsv.runsvstr,(runsdef *)val._0_8_,
                (runsdef *)stkval.runsv.runsvstr);
      }
      oswp2(*(void **)(*(long *)(in_RDI + 8) + 0x38),i);
      memcpy((void *)(*(long *)(*(long *)(in_RDI + 8) + 0x38) + 2),
             (void *)((long)pvVar5 + (ulong)(uVar3 + 1) + 2),(ulong)uVar4);
      *(ulong *)(*(long *)(in_RDI + 8) + 0x38) = *(long *)(*(long *)(in_RDI + 8) + 0x38) + (ulong)i;
      runrepush(*(runcxdef **)(in_RDI + 8),(runsdef *)&stack0xffffffffffffffd0);
    }
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
}

Assistant:

void bifcdr(bifcxdef *ctx, int argc)
{
    uchar   *lstp;
    uint     siz;
    uint     lstsiz;
    runsdef  val;
    runsdef  stkval;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_LIST);
    
    lstp = runpoplst(ctx->bifcxrun);
    stkval.runstyp = DAT_LIST;
    stkval.runsv.runsvstr = lstp;
    
    /* get list's size, and point to its data string */
    lstsiz = osrp2(lstp) - 2;
    lstp += 2;
    
    if (lstsiz != 0)
    {
        /* deduct size of first element from size of list */
        siz = datsiz(*lstp, lstp+1) + 1;
        lstsiz -= siz;

        /* add in the size prefix for our new list size */
        lstsiz += 2;

        /* allocate space for new list containing rest of list */
        runhres1(ctx->bifcxrun, lstsiz, 1, &stkval);
        lstp = stkval.runsv.runsvstr + siz + 2;

        /* write out size followed by list value string */
        oswp2(ctx->bifcxrun->runcxhp, lstsiz);
        memcpy(ctx->bifcxrun->runcxhp+2, lstp, (size_t)(lstsiz-2));
        
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        val.runstyp = DAT_LIST;
        ctx->bifcxrun->runcxhp += lstsiz;
        runrepush(ctx->bifcxrun, &val);
    }
    else
        runpush(ctx->bifcxrun, DAT_NIL, &val);   /* empty list - cdr is nil */
}